

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O2

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,string *name,
          bool param_2,cmake *cm)

{
  bool bVar1;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cmGlobalUnixMakefileGenerator3::GetActualName_abi_cxx11_();
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT71(in_register_00000011,param_2),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    local_40._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    std::make_unique<cmGlobalUnixMakefileGenerator3,cmake*&>((cmake **)&local_40);
  }
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory =
       (_func_int **)local_40._M_dataplus._M_p;
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }